

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

void Abc_NtkAigToGiaOne(Gia_Man_t *p,Abc_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  Hop_Man_t *p_00;
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar5;
  int local_50;
  int local_4c;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Hop_Obj_t *pHopObj;
  Hop_Man_t *pHopMan;
  Vec_Int_t *vMap_local;
  Abc_Ntk_t *pNtk_local;
  Gia_Man_t *p_local;
  
  iVar1 = Abc_NtkIsAigLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                  ,0x60,"void Abc_NtkAigToGiaOne(Gia_Man_t *, Abc_Ntk_t *, Vec_Int_t *)");
  }
  p_00 = (Hop_Man_t *)pNtk->pManFunc;
  pHVar3 = Hop_ManConst1(p_00);
  (pHVar3->field_0).iData = 1;
  Abc_NtkCleanCopy(pNtk);
  for (local_4c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_4c);
    iVar1 = Vec_IntEntry(vMap,local_4c);
    iVar1 = Gia_ManCiLit(p,iVar1);
    (pAVar4->field_6).iTemp = iVar1;
  }
  p_01 = Abc_NtkDfs(pNtk,1);
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p_01);
    if (iVar1 <= local_4c) {
      Vec_PtrFree(p_01);
      for (local_4c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_4c < iVar1; local_4c = local_4c + 1) {
        pAVar4 = Abc_NtkCo(pNtk,local_4c);
        pAVar4 = Abc_ObjFanin0(pAVar4);
        Gia_ManAppendCo(p,(pAVar4->field_6).iTemp);
      }
      return;
    }
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_01,local_4c);
    for (local_50 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_50 < iVar1; local_50 = local_50 + 1) {
      pAVar5 = Abc_ObjFanin(pAVar4,local_50);
      iVar1 = (pAVar5->field_6).iTemp;
      pHVar3 = Hop_ManPi(p_00,local_50);
      (pHVar3->field_0).iData = iVar1;
    }
    pHVar3 = Hop_Regular((Hop_Obj_t *)(pAVar4->field_5).pData);
    iVar1 = Abc_ObjFaninNum(pAVar4);
    iVar2 = Hop_ManPiNum(p_00);
    if (iVar2 < iVar1) break;
    iVar1 = Hop_DagSize(pHVar3);
    if (0 < iVar1) {
      Abc_ConvertHopToGia(p,pHVar3);
    }
    iVar1 = (pHVar3->field_0).iData;
    iVar2 = Hop_IsComplement((Hop_Obj_t *)(pAVar4->field_5).pData);
    iVar1 = Abc_LitNotCond(iVar1,iVar2);
    (pAVar4->field_6).iTemp = iVar1;
    local_4c = local_4c + 1;
  }
  __assert_fail("Abc_ObjFaninNum(pNode) <= Hop_ManPiNum(pHopMan)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                ,0x6e,"void Abc_NtkAigToGiaOne(Gia_Man_t *, Abc_Ntk_t *, Vec_Int_t *)");
}

Assistant:

void Abc_NtkAigToGiaOne( Gia_Man_t * p, Abc_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pHopObj;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    assert( Abc_NtkIsAigLogic(pNtk) );
    pHopMan = (Hop_Man_t *)pNtk->pManFunc;
    Hop_ManConst1(pHopMan)->iData = 1;
    // image primary inputs
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->iTemp = Gia_ManCiLit(p, Vec_IntEntry(vMap, i));
    // iterate through nodes used in the mapping
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Abc_ObjForEachFanin( pNode, pFanin, k )
            Hop_ManPi(pHopMan, k)->iData = pFanin->iTemp;
        pHopObj = Hop_Regular( (Hop_Obj_t *)pNode->pData );
        assert( Abc_ObjFaninNum(pNode) <= Hop_ManPiNum(pHopMan) );
        if ( Hop_DagSize(pHopObj) > 0 )
            Abc_ConvertHopToGia( p, pHopObj );
        pNode->iTemp = Abc_LitNotCond( pHopObj->iData, Hop_IsComplement( (Hop_Obj_t *)pNode->pData ) );
    }
    Vec_PtrFree( vNodes );
    // create primary outputs
    Abc_NtkForEachCo( pNtk, pNode, i )
        Gia_ManAppendCo( p, Abc_ObjFanin0(pNode)->iTemp );
}